

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::CylindricalMapping2D::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CylindricalMapping2D *this)

{
  Transform *in_RCX;
  
  StringPrintf<pbrt::Transform_const&>
            (__return_storage_ptr__,(pbrt *)"[ CylindricalMapping2D textureFromRender: %s ]",
             (char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string CylindricalMapping2D::ToString() const {
    return StringPrintf("[ CylindricalMapping2D textureFromRender: %s ]",
                        textureFromRender);
}